

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::AddTxOut
          (AbstractTransaction *this,Amount *value,Script *locking_script)

{
  void *pvVar1;
  int64_t iVar2;
  CfdException *this_00;
  allocator local_5d;
  int ret;
  undefined1 local_58 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  Script::GetData((ByteData *)local_58,locking_script);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                     (ByteData *)local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  pvVar1 = this->wally_tx_pointer_;
  iVar2 = Amount::GetSatoshiValue(value);
  ret = wally_tx_add_raw_output
                  (pvVar1,iVar2,local_38._M_impl.super__Vector_impl_data._M_start,
                   (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_38._M_impl.super__Vector_impl_data._M_start,0);
  if (ret == 0) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    return;
  }
  local_58._0_8_ = "cfdcore_transaction_common.cpp";
  local_58._8_4_ = 0x222;
  local_58._16_8_ = "AddTxOut";
  logger::warn<int&>((CfdSourceLocation *)local_58,"wally_tx_add_raw_output NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_58,"vout add error.",&local_5d);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::AddTxOut(
    const Amount &value, const Script &locking_script) {
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  int ret = wally_tx_add_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_),
      value.GetSatoshiValue(), script_data.data(), script_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }
}